

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref.h
# Opt level: O2

RefCount * __thiscall embree::RefCount::refInc(RefCount *this)

{
  LOCK();
  (this->refCounter).super___atomic_base<unsigned_long>._M_i =
       (this->refCounter).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  return this;
}

Assistant:

virtual RefCount* refInc() { refCounter.fetch_add(1); return this; }